

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwatson.c
# Opt level: O1

int watson_write_from_file_to_file(IOFormat input,IOFormat output,FILE *source,FILE *dest)

{
  int iVar1;
  Data data;
  
  iVar1 = -1;
  if (dest != (FILE *)0x0 && source != (FILE *)0x0) {
    data = (*decodeMap[input].parseStream)(source);
    if (data == (Data)0x0) {
      iVar1 = -2;
    }
    else {
      iVar1 = (*decodeMap[output].writeToStream)(data,dest);
      deepFreeData(data);
    }
  }
  return iVar1;
}

Assistant:

int watson_write_from_file_to_file(IOFormat input, IOFormat output, FILE *source, FILE *dest) {
    if (source == NULL || dest == NULL)return LIB_WATSON_INVALID_PARAMS;
    Data d = decodeMap[input].parseStream(source);
    if (d == NULL)return LIB_WATSON_PARSE_ERROR;
    int k = decodeMap[output].writeToStream(d, dest);
    deepFreeData(d);
    return k;
}